

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absDup.c
# Opt level: O2

Vec_Int_t * Gia_GlaCollectAssigned(Gia_Man_t *p,Vec_Int_t *vGateClasses)

{
  int *__base;
  int iVar1;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar2;
  size_t sVar3;
  int iVar4;
  long lVar5;
  size_t __nmemb;
  
  p_00 = Vec_IntAlloc(1000);
  iVar4 = 0;
  do {
    if (vGateClasses->nSize <= iVar4) {
      __nmemb = (size_t)p_00->nSize;
      if (1 < (long)__nmemb) {
        __base = p_00->pArray;
        qsort(__base,__nmemb,4,Vec_IntSortCompare1);
        iVar4 = 1;
        for (sVar3 = 1; __nmemb != sVar3; sVar3 = sVar3 + 1) {
          if (__base[sVar3] != __base[sVar3 - 1]) {
            lVar5 = (long)iVar4;
            iVar4 = iVar4 + 1;
            __base[lVar5] = __base[sVar3];
          }
        }
        p_00->nSize = iVar4;
      }
      return p_00;
    }
    iVar1 = Vec_IntEntry(vGateClasses,iVar4);
    if (iVar1 != 0) {
      if (iVar1 < 1) {
        __assert_fail("Entry > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absDup.c"
                      ,0x83,"Vec_Int_t *Gia_GlaCollectAssigned(Gia_Man_t *, Vec_Int_t *)");
      }
      pGVar2 = Gia_ManObj(p,iVar4);
      iVar1 = Gia_ObjId(p,pGVar2);
      Vec_IntPush(p_00,iVar1);
      if ((~*(uint *)pGVar2 & 0x1fffffff) == 0 || (int)*(uint *)pGVar2 < 0) {
        iVar1 = Gia_ObjIsRo(p,pGVar2);
        if (iVar1 == 0) {
          if ((~*(ulong *)pGVar2 & 0x1fffffff1fffffff) != 0) {
            __assert_fail("Gia_ObjIsConst0(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absDup.c"
                          ,0x8d,"Vec_Int_t *Gia_GlaCollectAssigned(Gia_Man_t *, Vec_Int_t *)");
          }
          goto LAB_004e6ea3;
        }
        pGVar2 = Gia_ObjRoToRi(p,pGVar2);
        iVar1 = Gia_ObjFaninId0p(p,pGVar2);
      }
      else {
        iVar1 = Gia_ObjFaninId0p(p,pGVar2);
        Vec_IntPush(p_00,iVar1);
        iVar1 = Gia_ObjId(p,pGVar2);
        iVar1 = iVar1 - (*(uint *)&pGVar2->field_0x4 & 0x1fffffff);
      }
      Vec_IntPush(p_00,iVar1);
    }
LAB_004e6ea3:
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Gia_GlaCollectAssigned( Gia_Man_t * p, Vec_Int_t * vGateClasses )
{
    Vec_Int_t * vAssigned;
    Gia_Obj_t * pObj;
    int i, Entry;
    vAssigned = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntry( vGateClasses, Entry, i )
    {
        if ( Entry == 0 )
            continue;
        assert( Entry > 0 );
        pObj = Gia_ManObj( p, i );
        Vec_IntPush( vAssigned, Gia_ObjId(p, pObj) );
        if ( Gia_ObjIsAnd(pObj) )
        {
            Vec_IntPush( vAssigned, Gia_ObjFaninId0p(p, pObj) );
            Vec_IntPush( vAssigned, Gia_ObjFaninId1p(p, pObj) );
        }
        else if ( Gia_ObjIsRo(p, pObj) )
            Vec_IntPush( vAssigned, Gia_ObjFaninId0p(p, Gia_ObjRoToRi(p, pObj)) );
        else assert( Gia_ObjIsConst0(pObj) );
    }
    Vec_IntUniqify( vAssigned );
    return vAssigned;
}